

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::flush(Logger *this,Level level,fstream_t *fs)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator iter;
  fstream_t *fs_local;
  Logger *pLStack_10;
  Level level_local;
  Logger *this_local;
  
  iter._M_node = (_Base_ptr)fs;
  fs_local._4_4_ = level;
  pLStack_10 = this;
  if ((fs == (fstream_t *)0x0) &&
     (bVar1 = el::base::TypedConfigurations::toFile(this->m_typedConfigurations,level), bVar1)) {
    iter._M_node = (_Base_ptr)
                   el::base::TypedConfigurations::fileStream
                             (this->m_typedConfigurations,fs_local._4_4_);
  }
  if (iter._M_node != (_Base_ptr)0x0) {
    std::ostream::flush();
    local_28._M_node =
         (_Base_ptr)
         el::base::utils::std::
         map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
         ::find(&this->m_unflushedCount,(key_type *)((long)&fs_local + 4));
    local_30._M_node =
         (_Base_ptr)
         el::base::utils::std::
         map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
         ::end(&this->m_unflushedCount);
    bVar1 = el::base::utils::std::operator!=(&local_28,&local_30);
    if (bVar1) {
      ppVar2 = el::base::utils::std::_Rb_tree_iterator<std::pair<const_el::Level,_unsigned_int>_>::
               operator->(&local_28);
      ppVar2->second = 0;
    }
  }
  return;
}

Assistant:

void Logger::flush(Level level, base::type::fstream_t* fs) {
  if (fs == nullptr && m_typedConfigurations->toFile(level)) {
    fs = m_typedConfigurations->fileStream(level);
  }
  if (fs != nullptr) {
    fs->flush();
    std::map<Level, unsigned int>::iterator iter = m_unflushedCount.find(level);
    if (iter != m_unflushedCount.end()) {
      iter->second = 0;
    }
  }
}